

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZlibReader.cpp
# Opt level: O1

void __thiscall ZlibReader::ZlibReader(ZlibReader *this)

{
  this->_vptr_ZlibReader = (_func_int **)&PTR__ZlibReader_00109d50;
  this->initialized = false;
  (this->zbuf).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->zbuf).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->zbuf).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->zbuf_crc = 0;
  reset_zlib(this);
  this->initialized = true;
  return;
}

Assistant:

ZlibReader::ZlibReader() :
	initialized(false),
	zbuf_crc(0)
{
	reset_zlib();
	initialized = true;
}